

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_and_subfaces<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *Nsimplex,Filtration_value *filtration)

{
  int iVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar2;
  int *piVar3;
  Filtration_value *filt;
  int iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  undefined8 *puVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar8;
  
  __first._M_current = (int *)*filtration;
  __last._M_current = (int *)filtration[1];
  if (__first._M_current == __last._M_current) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    if ((char)in_FS_OFFSET[-7] == '\0') {
      in_FS_OFFSET[-8] = 0;
      in_FS_OFFSET[-10] = 0;
      in_FS_OFFSET[-9] = 0;
      __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,*in_FS_OFFSET + -0x50,
                          &__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -7) = 1;
    }
    lVar2 = *in_FS_OFFSET;
    piVar3 = (int *)in_FS_OFFSET[-10];
    __position._M_current = (int *)in_FS_OFFSET[-9];
    if ((int *)in_FS_OFFSET[-9] != piVar3) {
      in_FS_OFFSET[-9] = (long)piVar3;
      __position._M_current = piVar3;
    }
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)(lVar2 + -0x50),__position,__first,__last);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (in_FS_OFFSET[-10],in_FS_OFFSET[-9]);
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-10],in_FS_OFFSET[-9]);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)(lVar2 + -0x50),(const_iterator)_Var5._M_current
               ,(int *)in_FS_OFFSET[-9]);
    _Var5._M_current = (int *)in_FS_OFFSET[-10];
    filt = (Filtration_value *)in_FS_OFFSET[-9];
    _Var7._M_current = _Var5._M_current;
    while ((Filtration_value *)_Var7._M_current != filt) {
      iVar1 = *_Var7._M_current;
      _Var7._M_current = (int *)((long)_Var7._M_current + 4);
      if (iVar1 == *(int *)&Nsimplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
    }
    iVar4 = (int)((ulong)((long)filt - (long)_Var5._M_current) >> 2) + -1;
    iVar1 = *(int *)&Nsimplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (iVar4 < iVar1) {
      iVar4 = iVar1;
    }
    *(int *)&Nsimplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = iVar4;
    pVar8 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (this,(Siblings *)Nsimplex,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       &Nsimplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,_Var5,filt);
    filtration = pVar8._8_8_;
  }
  pVar8._8_8_ = filtration;
  pVar8.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar8;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }